

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::arrayOfArrayVersionCheck
          (TParseContext *this,TSourceLoc *loc,TArraySizes *sizes)

{
  TVector<glslang::TArraySize> *pTVar1;
  
  if ((sizes != (TArraySizes *)0x0) &&
     ((pTVar1 = (sizes->sizes).sizes, pTVar1 == (TVector<glslang::TArraySize> *)0x0 ||
      (((long)(pTVar1->
              super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
              super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pTVar1->
              super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
              super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
              ._M_impl.super__Vector_impl_data._M_start & 0xffffffff0U) != 0x10)))) {
    TParseVersions::requireProfile((TParseVersions *)this,loc,0xe,"arrays of arrays");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,8,0x136,(char *)0x0,"arrays of arrays");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,6,0x1ae,(char *)0x0,"arrays of arrays");
    return;
  }
  return;
}

Assistant:

void TParseContext::arrayOfArrayVersionCheck(const TSourceLoc& loc, const TArraySizes* sizes)
{
    if (sizes == nullptr || sizes->getNumDims() == 1)
        return;

    const char* feature = "arrays of arrays";

    requireProfile(loc, EEsProfile | ECoreProfile | ECompatibilityProfile, feature);
    profileRequires(loc, EEsProfile, 310, nullptr, feature);
    profileRequires(loc, ECoreProfile | ECompatibilityProfile, 430, nullptr, feature);
}